

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O2

void __thiscall
shift_window_transformer::WindowAttention<float>::WindowAttention
          (WindowAttention<float> *this,int dim,int heads,int headDim,bool shifted,int windowSize,
          bool relativePosEmbedding)

{
  int *piVar1;
  ulong uVar2;
  double dVar3;
  result_type rVar4;
  uint uVar5;
  Linear<float> *pLVar6;
  CyclicShift<float> *pCVar7;
  Tensor<float> *pTVar8;
  Tensor<int> *pTVar9;
  int *piVar10;
  undefined4 in_register_0000008c;
  int iVar11;
  int windowSize_00;
  float fVar12;
  float local_2774;
  ulong local_2770;
  normal_distribution<double> local_2768;
  mt19937 gen;
  random_device rd;
  
  *(undefined ***)this = &PTR_forward_0010bae8;
  this->cyclicShift = (CyclicShift<float> *)0x0;
  this->cyclicBackShift = (CyclicShift<float> *)0x0;
  this->qLinear = (Linear<float> *)0x0;
  this->kLinear = (Linear<float> *)0x0;
  this->vLinear = (Linear<float> *)0x0;
  this->outLinear = (Linear<float> *)0x0;
  this->upperLowerMask = (Tensor<float> *)0x0;
  this->leftRightMask = (Tensor<float> *)0x0;
  this->relativeIndices = (Tensor<int> *)0x0;
  this->posEmbedding = (Tensor<float> *)0x0;
  this->softMax = (SoftMax<float>)&PTR_forward_0010bc00;
  local_2770 = CONCAT44(in_register_0000008c,windowSize);
  this->windowSize = windowSize;
  this->shifted = shifted;
  iVar11 = headDim * heads;
  this->innerDim = iVar11;
  this->headDim = headDim;
  dVar3 = (double)headDim;
  this->heads = heads;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  this->scale = (float)(1.0 / dVar3);
  this->relativePosEmbedding = relativePosEmbedding;
  pLVar6 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar6,dim,iVar11,false);
  this->qLinear = pLVar6;
  pLVar6 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar6,dim,iVar11,false);
  this->kLinear = pLVar6;
  pLVar6 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar6,dim,iVar11,false);
  this->vLinear = pLVar6;
  pLVar6 = (Linear<float> *)operator_new(0x28);
  Linear<float>::Linear(pLVar6,iVar11,dim);
  this->outLinear = pLVar6;
  if (shifted) {
    windowSize_00 = (int)local_2770;
    uVar2 = local_2770 & 0xffffffff;
    pCVar7 = (CyclicShift<float> *)operator_new(0x10);
    iVar11 = (int)((long)((ulong)(uint)(windowSize_00 >> 0x1f) << 0x20 | uVar2) / 2);
    *(undefined ***)pCVar7 = &PTR_forward_0010bc60;
    pCVar7->displacement = -iVar11;
    this->cyclicShift = pCVar7;
    pCVar7 = (CyclicShift<float> *)operator_new(0x10);
    *(undefined ***)pCVar7 = &PTR_forward_0010bc60;
    pCVar7->displacement = iVar11;
    this->cyclicBackShift = pCVar7;
    pTVar8 = create_mask<float>(windowSize_00,iVar11,true,false);
    this->upperLowerMask = pTVar8;
    pTVar8 = create_mask<float>(windowSize_00,iVar11,false,true);
    this->leftRightMask = pTVar8;
  }
  std::random_device::random_device(&rd);
  uVar5 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar5);
  local_2768._M_param._M_mean._0_4_ = 0;
  local_2768._M_param._M_mean._4_4_ = 0;
  local_2768._M_param._M_stddev._0_4_ = 0;
  local_2768._M_param._M_stddev._4_4_ = 0x3ff00000;
  local_2768._M_saved = 0.0;
  local_2768._M_saved_available = false;
  if (relativePosEmbedding) {
    pTVar9 = get_relative_distances<int>((int)local_2770);
    this->relativeIndices = pTVar9;
    piVar1 = (pTVar9->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    for (piVar10 = (pTVar9->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start; piVar10 != piVar1; piVar10 = piVar10 + 1) {
      *piVar10 = *piVar10 + (int)local_2770 + -1;
    }
    pTVar8 = (Tensor<float> *)operator_new(0x30);
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    this->posEmbedding = pTVar8;
    iVar11 = (int)local_2770 * 2 + -1;
    local_2770 = CONCAT44(local_2770._4_4_,iVar11);
    for (iVar11 = iVar11 * iVar11; pTVar8 = this->posEmbedding, 0 < iVar11; iVar11 = iVar11 + -1) {
      rVar4 = std::normal_distribution<double>::operator()(&local_2768,&gen);
      local_2774 = (float)rVar4;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&pTVar8->super_vector<float,_std::allocator<float>_>,&local_2774);
    }
    fVar12 = (float)local_2770;
    local_2774 = (float)local_2770;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&pTVar8->shape,(int *)&local_2774);
    local_2774 = fVar12;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->posEmbedding->shape,(int *)&local_2774);
  }
  else {
    pTVar8 = (Tensor<float> *)operator_new(0x30);
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pTVar8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (pTVar8->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    this->posEmbedding = pTVar8;
    uVar5 = (int)local_2770 * (int)local_2770;
    local_2770 = (ulong)uVar5;
    for (iVar11 = uVar5 * uVar5; pTVar8 = this->posEmbedding, 0 < iVar11; iVar11 = iVar11 + -1) {
      rVar4 = std::normal_distribution<double>::operator()(&local_2768,&gen);
      local_2774 = (float)rVar4;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&pTVar8->super_vector<float,_std::allocator<float>_>,&local_2774);
    }
    fVar12 = (float)local_2770;
    local_2774 = fVar12;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&pTVar8->shape,(int *)&local_2774);
    local_2774 = fVar12;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->posEmbedding->shape,(int *)&local_2774);
  }
  std::random_device::~random_device(&rd);
  return;
}

Assistant:

WindowAttention(int dim, int heads, int headDim, bool shifted, int windowSize, bool relativePosEmbedding)
                : shifted(shifted),
                  scale(1 / sqrt(headDim)),
                  innerDim(heads * headDim),
                  heads(heads),
                  headDim(headDim),
                  windowSize(windowSize),
                  relativePosEmbedding(relativePosEmbedding) {
            qLinear = new Linear<T>(dim, heads * headDim, false);
            kLinear = new Linear<T>(dim, heads * headDim, false);
            vLinear = new Linear<T>(dim, heads * headDim, false);
            outLinear = new Linear<T>(heads * headDim, dim);
            if (shifted) {
                int displacement = windowSize / 2;
                cyclicShift = new CyclicShift<T>(-displacement);
                cyclicBackShift = new CyclicShift<T>(displacement);
                upperLowerMask = create_mask<T>(windowSize, displacement, true, false);
                leftRightMask = create_mask<T>(windowSize, displacement, false, true);
            }
            std::random_device rd{};
            std::mt19937 gen{rd()};
            std::normal_distribution<> d{0, 1};
            if (relativePosEmbedding) {
                relativeIndices = get_relative_distances<int>(windowSize);
                for (auto &item: *relativeIndices) {
                    item = item + windowSize - 1;
                }
                posEmbedding = new Tensor<T>();
                int cnt = (2 * windowSize - 1) * (2 * windowSize - 1);
                while (cnt-- > 0) {
                    posEmbedding->push_back((T) d(gen));
                }
                posEmbedding->shape.push_back(2 * windowSize - 1);
                posEmbedding->shape.push_back(2 * windowSize - 1);
            } else {
                posEmbedding = new Tensor<T>();
                int cnt = windowSize * windowSize * windowSize * windowSize;
                while (cnt-- > 0) {
                    posEmbedding->push_back((T) d(gen));
                }
                posEmbedding->shape.push_back(windowSize * windowSize);
                posEmbedding->shape.push_back(windowSize * windowSize);
            }
        }